

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

ostream * tcu::operator<<(ostream *str,TextureFormat format)

{
  char *pcVar1;
  size_t sVar2;
  
  pcVar1 = *(char **)(&DAT_00d51b10 + (long)(int)format.order * 8);
  sVar2 = strlen(pcVar1);
  std::__ostream_insert<char,std::char_traits<char>>(str,pcVar1,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>(str,", ",2);
  pcVar1 = (&PTR_anon_var_dwarf_24bcf4c_00d51bc0)[(long)format >> 0x20];
  sVar2 = strlen(pcVar1);
  std::__ostream_insert<char,std::char_traits<char>>(str,pcVar1,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>(str,"",0);
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, TextureFormat format)
{
	return str << format.order << ", " << format.type << "";
}